

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void print_node(c2m_ctx_t c2m_ctx,FILE *f,node_t_conflict n,int indent,int attr_p)

{
  char *pcVar1;
  node_t_conflict pnVar2;
  pos_t pos;
  code *local_88;
  char *local_80;
  char *local_70;
  int local_2c;
  int i;
  int attr_p_local;
  int indent_local;
  node_t_conflict n_local;
  FILE *f_local;
  c2m_ctx_t c2m_ctx_local;
  
  fprintf((FILE *)f,"%6u: ",(ulong)n->uid);
  for (local_2c = 0; local_2c < indent; local_2c = local_2c + 1) {
    fprintf((FILE *)f," ");
  }
  if (n != &err_struct) {
    pcVar1 = get_node_name(n->code);
    fprintf((FILE *)f,"%s (",pcVar1);
    pos = get_node_pos(c2m_ctx,n);
    print_pos(f,pos,0);
    fprintf((FILE *)f,")");
    switch(n->code) {
    case N_IGNORE:
      fprintf((FILE *)f,"\n");
      return;
    case N_I:
      fprintf((FILE *)f," %lld",(n->u).s.s);
      break;
    case N_L:
      fprintf((FILE *)f," %lldl",(n->u).s.s);
      break;
    case N_LL:
      fprintf((FILE *)f," %lldll",(n->u).s.s);
      break;
    case N_U:
      fprintf((FILE *)f," %lluu",(n->u).s.s);
      break;
    case N_UL:
      fprintf((FILE *)f," %lluul",(n->u).s.s);
      break;
    case N_ULL:
      fprintf((FILE *)f," %lluull",(n->u).s.s);
      break;
    case N_F:
      fprintf((FILE *)f," %.*g",(double)(n->u).f,0x18);
      break;
    case N_D:
      fprintf((FILE *)f," %.*g",(n->u).s.s,0x35);
      break;
    case N_LD:
      fprintf((FILE *)f," %.*Lg",0x40);
      break;
    case N_CH:
    case N_CH16:
    case N_CH32:
      if (n->code == N_CH) {
        local_70 = "";
      }
      else {
        local_70 = "U";
        if (n->code == N_CH16) {
          local_70 = "u";
        }
      }
      fprintf((FILE *)f," %s\'",local_70);
      print_char(f,(long)(n->u).ch);
      fprintf((FILE *)f,"\'");
      break;
    case N_STR:
    case N_STR16:
    case N_STR32:
      if (n->code == N_STR) {
        local_80 = "";
      }
      else {
        local_80 = "U";
        if (n->code == N_STR16) {
          local_80 = "u";
        }
      }
      fprintf((FILE *)f," %s\"",local_80);
      if (n->code == N_STR) {
        local_88 = print_chars;
      }
      else {
        local_88 = print_chars32;
        if (n->code == N_STR16) {
          local_88 = print_chars16;
        }
      }
      (*local_88)(f,(n->u).s.s,(n->u).s.len);
      fprintf((FILE *)f,"\"");
      break;
    case N_ID:
      fprintf((FILE *)f," %s",(n->u).s.s);
      break;
    case N_COMMA:
    case N_ANDAND:
    case N_OROR:
    case N_STMTEXPR:
    case N_EQ:
    case N_NE:
    case N_LT:
    case N_LE:
    case N_GT:
    case N_GE:
    case N_ASSIGN:
    case N_BITWISE_NOT:
    case N_NOT:
    case N_AND:
    case N_AND_ASSIGN:
    case N_OR:
    case N_OR_ASSIGN:
    case N_XOR:
    case N_XOR_ASSIGN:
    case N_LSH:
    case N_LSH_ASSIGN:
    case N_RSH:
    case N_RSH_ASSIGN:
    case N_ADD:
    case N_ADD_ASSIGN:
    case N_SUB:
    case N_SUB_ASSIGN:
    case N_MUL:
    case N_MUL_ASSIGN:
    case N_DIV:
    case N_DIV_ASSIGN:
    case N_MOD:
    case N_MOD_ASSIGN:
    case N_IND:
    case N_FIELD:
    case N_ADDR:
    case N_DEREF:
    case N_DEREF_FIELD:
    case N_COND:
    case N_INC:
    case N_DEC:
    case N_POST_INC:
    case N_POST_DEC:
    case N_ALIGNOF:
    case N_SIZEOF:
    case N_EXPR_SIZEOF:
    case N_CAST:
    case N_COMPOUND_LITERAL:
    case N_CALL:
    case N_GENERIC:
    case N_LABEL_ADDR:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
      }
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_GENERIC_ASSOC:
    case N_IF:
    case N_WHILE:
    case N_DO:
    case N_CONTINUE:
    case N_BREAK:
    case N_RETURN:
    case N_EXPR:
    case N_CASE:
    case N_DEFAULT:
    case N_LABEL:
    case N_SHARE:
    case N_TYPEDEF:
    case N_EXTERN:
    case N_STATIC:
    case N_AUTO:
    case N_REGISTER:
    case N_THREAD_LOCAL:
    case N_DECL:
    case N_VOID:
    case N_CHAR:
    case N_SHORT:
    case N_INT:
    case N_LONG:
    case N_FLOAT:
    case N_DOUBLE:
    case N_SIGNED:
    case N_UNSIGNED:
    case N_BOOL:
    case N_CONST:
    case N_RESTRICT:
    case N_VOLATILE:
    case N_ATOMIC:
    case N_INLINE:
    case N_NO_RETURN:
    case N_ALIGNAS:
    case N_STAR:
    case N_POINTER:
    case N_DOTS:
    case N_ARR:
    case N_INIT:
    case N_FIELD_ID:
    case N_TYPE:
    case N_ST_ASSERT:
    case N_ASM:
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_SWITCH:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,": ");
        print_type(c2m_ctx,f,(type *)n->attr);
      }
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_GOTO:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,": target node %u\n",(ulong)*(uint *)((long)n->attr + 4));
      }
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_INDIRECT_GOTO:
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_LIST:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,": ");
        print_decl_spec(c2m_ctx,f,(decl_spec *)n->attr);
      }
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_SPEC_DECL:
    case N_MEMBER:
    case N_FUNC_DEF:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        print_decl(c2m_ctx,f,(decl_t)n->attr);
      }
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_ENUM:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,": enum_basic_type = ");
        print_basic_type(f,*n->attr);
        fprintf((FILE *)f,"\n");
      }
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_ENUM_CONST:
      if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,": val = %lld\n",*n->attr);
      }
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_FUNC:
      if ((attr_p == 0) || (n->attr == (void *)0x0)) {
        fprintf((FILE *)f,"\n");
        print_ops(c2m_ctx,f,n,indent,attr_p);
        return;
      }
    case N_FOR:
    case N_BLOCK:
    case N_STRUCT:
    case N_UNION:
    case N_MODULE:
      if ((attr_p == 0) ||
         (((n->code == N_STRUCT || (n->code == N_UNION)) &&
          ((pnVar2 = DLIST_node_t_el(&(n->u).ops,1), pnVar2 == (node_t_conflict)0x0 ||
           (pnVar2 = DLIST_node_t_el(&(n->u).ops,1), pnVar2->code == N_IGNORE)))))) {
        fprintf((FILE *)f,"\n");
      }
      else if (n->code == N_MODULE) {
        fprintf((FILE *)f,": the top scope");
      }
      else if (n->attr != (void *)0x0) {
        fprintf((FILE *)f,": higher scope node %u",
                (ulong)*(uint *)(*(long *)((long)n->attr + 0x20) + 4));
      }
      if ((n->code == N_STRUCT) || (n->code == N_UNION)) {
        fprintf((FILE *)f,"\n");
      }
      else if ((attr_p != 0) && (n->attr != (void *)0x0)) {
        fprintf((FILE *)f,", size = %llu, offset = %llu\n",*(undefined8 *)((long)n->attr + 8),
                *(undefined8 *)((long)n->attr + 0x10));
      }
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    case N_ATTR:
      fprintf((FILE *)f,"\n");
      print_ops(c2m_ctx,f,n,indent,attr_p);
      return;
    default:
      abort();
    }
    if ((attr_p != 0) && (n->attr != (void *)0x0)) {
      print_expr(c2m_ctx,f,(expr_conflict *)n->attr);
    }
    fprintf((FILE *)f,"\n");
    return;
  }
  fprintf((FILE *)f,"<error>\n");
  return;
}

Assistant:

static void print_node (c2m_ctx_t c2m_ctx, FILE *f, node_t n, int indent, int attr_p) {
  int i;

  fprintf (f, "%6u: ", n->uid);
  for (i = 0; i < indent; i++) fprintf (f, " ");
  if (n == err_node) {
    fprintf (f, "<error>\n");
    return;
  }
  fprintf (f, "%s (", get_node_name (n->code));
  print_pos (f, POS (n), FALSE);
  fprintf (f, ")");
  switch (n->code) {
  case N_IGNORE: fprintf (f, "\n"); break;
  case N_I: fprintf (f, " %lld", (long long) n->u.l); goto expr;
  case N_L: fprintf (f, " %lldl", (long long) n->u.l); goto expr;
  case N_LL: fprintf (f, " %lldll", (long long) n->u.ll); goto expr;
  case N_U: fprintf (f, " %lluu", (unsigned long long) n->u.ul); goto expr;
  case N_UL: fprintf (f, " %lluul", (unsigned long long) n->u.ul); goto expr;
  case N_ULL: fprintf (f, " %lluull", (unsigned long long) n->u.ull); goto expr;
  case N_F: fprintf (f, " %.*g", FLT_MANT_DIG, (double) n->u.f); goto expr;
  case N_D: fprintf (f, " %.*g", DBL_MANT_DIG, (double) n->u.d); goto expr;
  case N_LD: fprintf (f, " %.*Lg", LDBL_MANT_DIG, (long double) n->u.ld); goto expr;
  case N_CH:
  case N_CH16:
  case N_CH32:
    fprintf (f, " %s'", n->code == N_CH ? "" : n->code == N_CH16 ? "u" : "U");
    print_char (f, n->u.ch);
    fprintf (f, "'");
    goto expr;
  case N_STR:
  case N_STR16:
  case N_STR32:
    fprintf (f, " %s\"", n->code == N_STR ? "" : n->code == N_STR16 ? "u" : "U");
    (n->code == N_STR     ? print_chars
     : n->code == N_STR16 ? print_chars16
                          : print_chars32) (f, n->u.s.s, n->u.s.len);
    fprintf (f, "\"");
    goto expr;
  case N_ID:
    fprintf (f, " %s", n->u.s.s);
  expr:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    break;
  case N_COMMA:
  case N_ANDAND:
  case N_OROR:
  case N_EQ:
  case N_NE:
  case N_LT:
  case N_LE:
  case N_GT:
  case N_GE:
  case N_ASSIGN:
  case N_BITWISE_NOT:
  case N_NOT:
  case N_AND:
  case N_AND_ASSIGN:
  case N_OR:
  case N_OR_ASSIGN:
  case N_XOR:
  case N_XOR_ASSIGN:
  case N_LSH:
  case N_LSH_ASSIGN:
  case N_RSH:
  case N_RSH_ASSIGN:
  case N_ADD:
  case N_ADD_ASSIGN:
  case N_SUB:
  case N_SUB_ASSIGN:
  case N_MUL:
  case N_MUL_ASSIGN:
  case N_DIV:
  case N_DIV_ASSIGN:
  case N_MOD:
  case N_MOD_ASSIGN:
  case N_IND:
  case N_FIELD:
  case N_ADDR:
  case N_DEREF:
  case N_DEREF_FIELD:
  case N_COND:
  case N_INC:
  case N_DEC:
  case N_POST_INC:
  case N_POST_DEC:
  case N_ALIGNOF:
  case N_SIZEOF:
  case N_EXPR_SIZEOF:
  case N_CAST:
  case N_COMPOUND_LITERAL:
  case N_CALL:
  case N_GENERIC:
  case N_STMTEXPR:
  case N_LABEL_ADDR:
    if (attr_p && n->attr != NULL) print_expr (c2m_ctx, f, n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GENERIC_ASSOC:
  case N_IF:
  case N_WHILE:
  case N_DO:
  case N_CONTINUE:
  case N_BREAK:
  case N_RETURN:
  case N_EXPR:
  case N_CASE:
  case N_DEFAULT:
  case N_LABEL:
  case N_SHARE:
  case N_TYPEDEF:
  case N_EXTERN:
  case N_STATIC:
  case N_AUTO:
  case N_REGISTER:
  case N_THREAD_LOCAL:
  case N_DECL:
  case N_VOID:
  case N_CHAR:
  case N_SHORT:
  case N_INT:
  case N_LONG:
  case N_FLOAT:
  case N_DOUBLE:
  case N_SIGNED:
  case N_UNSIGNED:
  case N_BOOL:
  case N_CONST:
  case N_RESTRICT:
  case N_VOLATILE:
  case N_ATOMIC:
  case N_INLINE:
  case N_NO_RETURN:
  case N_ALIGNAS:
  case N_STAR:
  case N_POINTER:
  case N_DOTS:
  case N_ARR:
  case N_INIT:
  case N_FIELD_ID:
  case N_TYPE:
  case N_ST_ASSERT:
  case N_ASM:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ATTR:
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_LIST:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_decl_spec (c2m_ctx, f, (struct decl_spec *) n->attr);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SPEC_DECL:
  case N_MEMBER:
  case N_FUNC_DEF:
    if (attr_p && n->attr != NULL) print_decl (c2m_ctx, f, (decl_t) n->attr);
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_FUNC:
    if (!attr_p || n->attr == NULL) {
      fprintf (f, "\n");
      print_ops (c2m_ctx, f, n, indent, attr_p);
      break;
    }
    /* fall through */
  case N_STRUCT:
  case N_UNION:
  case N_MODULE:
  case N_BLOCK:
  case N_FOR:
    if (!attr_p
        || ((n->code == N_STRUCT || n->code == N_UNION)
            && (NL_EL (n->u.ops, 1) == NULL || NL_EL (n->u.ops, 1)->code == N_IGNORE)))
      fprintf (f, "\n");
    else if (n->code == N_MODULE)
      fprintf (f, ": the top scope");
    else if (n->attr != NULL)
      fprintf (f, ": higher scope node %u", ((struct node_scope *) n->attr)->scope->uid);
    if (n->code == N_STRUCT || n->code == N_UNION)
      fprintf (f, "\n");
    else if (attr_p && n->attr != NULL)
      fprintf (f, ", size = %llu, offset = %llu\n",
               (unsigned long long) ((struct node_scope *) n->attr)->size,
               (unsigned long long) ((struct node_scope *) n->attr)->offset);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_SWITCH:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": ");
      print_type (c2m_ctx, f, &((struct switch_attr *) n->attr)->type);
    }
    fprintf (f, "\n");
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_GOTO:
    if (attr_p && n->attr != NULL) fprintf (f, ": target node %u\n", ((node_t) n->attr)->uid);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_INDIRECT_GOTO: print_ops (c2m_ctx, f, n, indent, attr_p); break;
  case N_ENUM:
    if (attr_p && n->attr != NULL) {
      fprintf (f, ": enum_basic_type = ");
      print_basic_type (f, ((struct enum_type *) n->attr)->enum_basic_type);
      fprintf (f, "\n");
    }
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  case N_ENUM_CONST:
    if (attr_p && n->attr != NULL)  // ???!!!
      fprintf (f, ": val = %lld\n", (long long) ((struct enum_value *) n->attr)->u.i_val);
    print_ops (c2m_ctx, f, n, indent, attr_p);
    break;
  default: abort ();
  }
}